

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::anon_unknown_1::SamplesCase::test(SamplesCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  ostringstream *this_01;
  int iVar2;
  TestContext *pTVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> samples;
  StateQueryMemoryWriteGuard<int> sampleCounts;
  StateQueryMemoryWriteGuard<int> maxSamples;
  vector<int,_std::allocator<int>_> local_1e8;
  StateQueryMemoryWriteGuard<int> local_1d0;
  StateQueryMemoryWriteGuard<int> local_1c4;
  CallLogWrapper *local_1b8;
  undefined1 local_1b0 [384];
  
  local_1d0.m_preguard = -0x21212122;
  local_1d0.m_value = -0x21212122;
  local_1d0.m_postguard = -0x21212122;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetInternalformativ
            (this_00,0x8d41,this->m_internalFormat,0x9380,1,&local_1d0.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1d0,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar4) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// sample counts is ",0x14);
    std::ostream::operator<<(poVar1,local_1d0.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if ((long)local_1d0.m_value != 0) {
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (GLint *)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&local_1e8,(long)local_1d0.m_value,(value_type_conflict1 *)local_1b0);
      glu::CallLogWrapper::glGetInternalformativ
                (this_00,0x8d41,this->m_internalFormat,0x80a9,local_1d0.m_value,
                 local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      ApiCase::expectError(&this->super_ApiCase,0);
      local_1b8 = this_00;
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        this_01 = (ostringstream *)(local_1b0 + 8);
        uVar6 = 0;
        iVar5 = 0;
        do {
          iVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
          if (iVar2 < 1) {
            local_1b0._0_8_ =
                 ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// ERROR: Expected sample count to be at least one; got ",
                       0x38);
            std::ostream::operator<<(poVar1,iVar2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid value");
            }
          }
          if ((uVar6 != 0) && (iVar5 <= iVar2)) {
            local_1b0._0_8_ =
                 ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log;
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,
                       "// ERROR: Expected sample count to be ordered in descending order;",0x42);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"got ",4);
            std::ostream::operator<<(this_01,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," at index ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)this_01);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", and ",6);
            std::ostream::operator<<(this_01,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," at index ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)this_01);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_01);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid order");
            }
          }
          uVar6 = uVar6 + 1;
          iVar5 = iVar2;
        } while (uVar6 < (ulong)((long)local_1e8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if (this->m_isIntegerInternalFormat == false) {
        local_1c4.m_preguard = -0x21212122;
        local_1c4.m_value = -0x21212122;
        local_1c4.m_postguard = -0x21212122;
        glu::CallLogWrapper::glGetIntegerv(local_1b8,0x8d57,&local_1c4.m_value);
        ApiCase::expectError(&this->super_ApiCase,0);
        bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          (&local_1c4,
                           (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (bVar4) {
          iVar5 = *local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (iVar5 < local_1c4.m_value) {
            local_1b0._0_8_ =
                 ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// ERROR: Expected maximum value in SAMPLES (",0x2d);
            std::ostream::operator<<(poVar1,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") to be at least the value of MAX_SAMPLES (",0x2b);
            std::ostream::operator<<(poVar1,local_1c4.m_value);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar3,QP_TEST_RESULT_FAIL,"got invalid maximum sample count");
            }
          }
        }
      }
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		StateQueryMemoryWriteGuard<GLint> sampleCounts;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCounts);
		expectError(GL_NO_ERROR);

		if (!sampleCounts.verifyValidity(m_testCtx))
			return;

		m_testCtx.getLog() << TestLog::Message << "// sample counts is " << sampleCounts << TestLog::EndMessage;

		if (sampleCounts == 0)
			return;

		std::vector<GLint> samples;
		samples.resize(sampleCounts, -1);
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_SAMPLES, sampleCounts, &samples[0]);
		expectError(GL_NO_ERROR);

		GLint prevSampleCount = 0;
		GLint sampleCount = 0;
		for (size_t ndx = 0; ndx < samples.size(); ++ndx, prevSampleCount = sampleCount)
		{
			sampleCount = samples[ndx];

			// sample count must be > 0
			if (sampleCount <= 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected sample count to be at least one; got " << sampleCount << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}

			// samples must be ordered descending
			if (ndx != 0 && !(sampleCount < prevSampleCount))
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected sample count to be ordered in descending order;"
					<< "got " << prevSampleCount << " at index " << (ndx - 1) << ", and " << sampleCount << " at index " << ndx << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid order");
			}
		}

		if (!m_isIntegerInternalFormat)
		{
			// the maximum value in SAMPLES is guaranteed to be at least the value of MAX_SAMPLES
			StateQueryMemoryWriteGuard<GLint> maxSamples;
			glGetIntegerv(GL_MAX_SAMPLES, &maxSamples);
			expectError(GL_NO_ERROR);

			if (maxSamples.verifyValidity(m_testCtx))
			{
				const GLint maximumFormatSampleCount = samples[0];
				if (!(maximumFormatSampleCount >= maxSamples))
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected maximum value in SAMPLES (" << maximumFormatSampleCount << ") to be at least the value of MAX_SAMPLES (" << maxSamples << ")" << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid maximum sample count");
				}
		  }
		}
	}